

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O1

string * __thiscall
pbrt::FindMatchingNamedSpectrum_abi_cxx11_
          (string *__return_storage_ptr__,pbrt *this,SpectrumHandle *s)

{
  string *psVar1;
  _Rb_tree_node_base *p_Var2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  Float FVar6;
  DispatchSplit<7> local_75;
  undefined4 local_74;
  undefined4 local_70;
  float local_6c;
  string *local_68;
  _Rb_tree_node_base *local_60;
  ulong local_58;
  pbrt *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  p_Var2 = (_Rb_tree_node_base *)Spectra::(anonymous_namespace)::namedSpectra_abi_cxx11_._24_8_;
  local_68 = __return_storage_ptr__;
  local_50 = this;
  do {
    psVar1 = local_68;
    if (p_Var2 == (_Rb_tree_node_base *)
                  (Spectra::(anonymous_namespace)::namedSpectra_abi_cxx11_ + 8)) {
      (local_68->_M_dataplus)._M_p = (pointer)&local_68->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"");
      return psVar1;
    }
    local_38 = *(ulong *)local_50;
    local_40 = *(ulong *)(p_Var2 + 2);
    local_48 = local_38 >> 0x30;
    uVar4 = local_40 >> 0x30;
    bVar5 = false;
    lVar3 = 0;
    local_60 = p_Var2;
    do {
      local_74 = *(undefined4 *)((long)&DAT_00469500 + lVar3);
      local_58 = local_38;
      local_70 = local_74;
      local_6c = DispatchSplit<7>::operator()(&local_75,&local_74,&local_58,local_48);
      local_74 = local_70;
      local_58 = local_40;
      FVar6 = DispatchSplit<7>::operator()(&local_75,&local_74,&local_58,uVar4);
      psVar1 = local_68;
      if ((local_6c != FVar6) || (NAN(local_6c) || NAN(FVar6))) break;
      lVar3 = lVar3 + 4;
      bVar5 = lVar3 == 0x38;
    } while (!bVar5);
    if (bVar5) {
      (local_68->_M_dataplus)._M_p = (pointer)&local_68->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_68,*(long *)(local_60 + 1),
                 (long)&(local_60[1]._M_parent)->_M_color + *(long *)(local_60 + 1));
      return psVar1;
    }
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_60);
  } while( true );
}

Assistant:

std::string FindMatchingNamedSpectrum(SpectrumHandle s) {
    auto sampledLambdasMatch = [](SpectrumHandle a, SpectrumHandle b) {
        const Float wls[] = {306, 360.932007, 380, 402, 455, 503, 579,
                             610, 660,        692, 702, 760, 800, 860};
        for (Float lambda : wls)
            if (a(lambda) != b(lambda))
                return false;
        return true;
    };
    for (const auto &spd : Spectra::namedSpectra) {
        if (sampledLambdasMatch(s, spd.second))
            return spd.first;
    }
    return "";
}